

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
::find_position<std::__cxx11::string>
          (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::Identity,google::dense_hash_set<std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  Hasher *this_00;
  long lVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  
  lVar1 = *(long *)(this + 0x90);
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  if (key->_M_string_length == 0) {
    uVar5 = 0;
  }
  else {
    sVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = (long)(key->_M_dataplus)._M_p[sVar3] + uVar5 * 0x21;
      sVar3 = sVar3 + 1;
    } while (key->_M_string_length != sVar3);
  }
  this_00 = (Hasher *)(this + 0x30);
  uVar5 = uVar5 & lVar1 - 1U;
  bVar2 = Hasher::operator()(this_00,(string *)(this + 0x60),
                             (string *)(uVar5 * 0x20 + *(long *)(this + 0xa0)));
  uVar4 = uVar5;
  if (!bVar2) {
    uVar6 = 0xffffffffffffffff;
    lVar7 = 1;
    do {
      if ((*(long *)(this + 0x80) == 0) ||
         (bVar2 = Hasher::operator()(this_00,(string *)(this + 0x40),
                                     (string *)(uVar5 * 0x20 + *(long *)(this + 0xa0))), !bVar2)) {
        bVar2 = Hasher::operator()(this_00,key,(string *)(uVar5 * 0x20 + *(long *)(this + 0xa0)));
        if (bVar2) {
          uVar4 = 0xffffffffffffffff;
          goto LAB_00a2650d;
        }
      }
      else if (uVar6 == 0xffffffffffffffff) {
        uVar6 = uVar5;
      }
      uVar5 = uVar5 + lVar7 & lVar1 - 1U;
      bVar2 = Hasher::operator()(this_00,(string *)(this + 0x60),
                                 (string *)(uVar5 * 0x20 + *(long *)(this + 0xa0)));
      lVar7 = lVar7 + 1;
    } while (!bVar2);
    uVar4 = uVar5;
    if (uVar6 != 0xffffffffffffffff) {
      uVar4 = uVar6;
    }
  }
  uVar5 = 0xffffffffffffffff;
LAB_00a2650d:
  pVar8.second = uVar4;
  pVar8.first = uVar5;
  return pVar8;
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }